

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall
File::File(File *this,string *inPath,int umask,bool forRead,bool forWrite,bool create,bool truncate)

{
  int __fd;
  char *pcVar1;
  int *piVar2;
  undefined8 uVar3;
  FILE *pFVar4;
  byte in_CL;
  uint in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  int fd;
  int flags;
  string fileMode;
  uint local_50;
  allocator local_49;
  string local_48 [48];
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  uint local_14;
  
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  local_17 = in_R9B & 1;
  local_18 = in_stack_00000008 & 1;
  *in_RDI = &PTR__File_0017dd58;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  in_RDI[6] = 0;
  *(byte *)((long)in_RDI + 0x2a) = local_15 & 1;
  *(byte *)((long)in_RDI + 0x2b) = local_16 & 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  *(undefined1 *)(in_RDI + 5) = 0;
  if (((local_15 & 1) != 0) || ((local_16 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_50 = 0;
    if (((local_15 & 1) == 0) && ((local_16 & 1) != 0)) {
      local_50 = 0x241;
    }
    if (((local_15 & 1) != 0) && ((local_16 & 1) != 0)) {
      local_50 = local_50 | 2;
    }
    if ((((local_15 & 1) != 0) && ((local_16 & 1) != 0)) && ((local_17 & 1) != 0)) {
      local_50 = local_50 | 0x40;
    }
    if ((((local_15 & 1) != 0) && ((local_16 & 1) != 0)) &&
       (((local_17 & 1) != 0 && ((local_18 & 1) != 0)))) {
      local_50 = local_50 | 0x200;
    }
    pcVar1 = (char *)std::__cxx11::string::c_str();
    __fd = open(pcVar1,local_50,(ulong)(~local_14 & 0x1b6));
    if (__fd == -1) {
      piVar2 = __errno_location();
      pcVar1 = strerror(*piVar2);
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(3,"File",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/File.cpp"
                 ,0x5e,"Could not open the file (%s): %s",pcVar1,uVar3);
      *(undefined1 *)(in_RDI + 5) = 0;
    }
    else {
      if (((local_15 & 1) != 0) && ((local_16 & 1) == 0)) {
        std::__cxx11::string::operator=(local_48,"r");
      }
      if (((local_15 & 1) == 0) && ((local_16 & 1) != 0)) {
        std::__cxx11::string::operator=(local_48,"w");
      }
      if ((((local_15 & 1) != 0) && ((local_16 & 1) != 0)) && ((local_17 & 1) == 0)) {
        std::__cxx11::string::operator=(local_48,"r+");
      }
      if ((((local_15 & 1) != 0) && ((local_16 & 1) != 0)) && ((local_17 & 1) != 0)) {
        std::__cxx11::string::operator=(local_48,"w+");
      }
      pcVar1 = (char *)std::__cxx11::string::c_str();
      pFVar4 = fdopen(__fd,pcVar1);
      in_RDI[6] = pFVar4;
      *(bool *)(in_RDI + 5) = pFVar4 != (FILE *)0x0;
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

File::File(std::string inPath, int umask, bool forRead /* = true */, bool forWrite /* = false */, bool create /* = false */, bool truncate /* = true */)
{
	stream = NULL;

	isReadable = forRead;
	isWritable = forWrite;
	locked = false;

	path = inPath;
	valid = false;

	if (forRead || forWrite)
	{
		std::string fileMode = "";
		int flags, fd;

#ifndef _WIN32
		flags = 0;
		if (forRead && !forWrite) flags |= O_RDONLY;
		if (!forRead && forWrite) flags |= O_WRONLY | O_CREAT | O_TRUNC;
		if (forRead && forWrite) flags |= O_RDWR;
		if (forRead && forWrite && create) flags |= O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= O_TRUNC;
		// Open the file
		fd = open(path.c_str(), flags, (S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH) & ~umask);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "r";
		if (!forRead && forWrite) fileMode = "w";
		if (forRead && forWrite && !create) fileMode = "r+";
		if (forRead && forWrite && create) fileMode = "w+";
		// Open the stream
		valid = ((stream = fdopen(fd, fileMode.c_str())) != NULL);
#else
		(void)umask;
		flags = _O_BINARY;
		if (forRead && !forWrite) flags |= _O_RDONLY;
		if (!forRead && forWrite) flags |= _O_WRONLY | _O_CREAT | _O_TRUNC;
		if (forRead && forWrite) flags |= _O_RDWR;
		if (forRead && forWrite && create) flags |= _O_CREAT;
		if (forRead && forWrite && create && truncate) flags |= _O_TRUNC;
		// Open the file
		fd = _open(path.c_str(), flags, _S_IREAD | _S_IWRITE);
		if (fd == -1)
		{
			ERROR_MSG("Could not open the file (%s): %s", strerror(errno), path.c_str());
			valid = false;
			return;
		}

		if (forRead && !forWrite) fileMode = "rb";
		if (!forRead && forWrite) fileMode = "wb";
		if (forRead && forWrite && !create) fileMode = "rb+";
		if (forRead && forWrite && create) fileMode = "wb+";
		// Open the stream
		valid = ((stream = _fdopen(fd, fileMode.c_str())) != NULL);
#endif
	}
}